

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

work_thread_shptr_t __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::search_and_remove_agent_from_map
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  on_enter_handler_t *__mutex;
  int iVar1;
  state_t *psVar2;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  const_iterator __position;
  state_t **ppsVar3;
  bool bVar4;
  work_thread_shptr_t wVar5;
  
  __mutex = &(agent->st_default).m_on_enter;
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t = (_func_int **)0x0;
  *(undefined8 *)&this->m_params = 0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (((char)(agent->st_default).m_substate_count == '\0') &&
       (psVar2 = (agent->st_default).m_initial_substate, psVar2 != (state_t *)0x0)) {
      ppsVar3 = &(agent->st_default).m_parent_state;
      __position._M_node = (_Base_ptr)ppsVar3;
      do {
        bVar4 = *(ulong *)((long)&(psVar2->m_state_name).field_2 + 8) < in_RDX;
        if (!bVar4) {
          __position._M_node = (_Base_ptr)psVar2;
        }
        psVar2 = (state_t *)(&(psVar2->m_state_name)._M_string_length)[bVar4];
      } while (psVar2 != (state_t *)0x0);
      if ((__position._M_node != (_Base_ptr)ppsVar3) &&
         (*(ulong *)(__position._M_node + 1) <= in_RDX)) {
        (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
             (_func_int **)__position._M_node[1]._M_parent;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_params,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__position._M_node[1]._M_left);
        std::
        _Rb_tree<const_so_5::agent_t_*,_std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>,_std::_Select1st<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<const_so_5::agent_t_*,_std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>,_std::_Select1st<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>_>
                        *)((long)&(agent->st_default).m_state_name.field_2 + 8),__position);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    wVar5.
    super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    wVar5.
    super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (work_thread_shptr_t)
           wVar5.
           super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

work_thread_shptr_t
		search_and_remove_agent_from_map(
			const agent_t & agent )
			{
				work_thread_shptr_t result;

				std::lock_guard< std::mutex > lock( m_lock );

				if( !m_shutdown_started )
				{
					auto it = m_agent_threads.find( &agent );

					if( m_agent_threads.end() != it )
					{
						result = it->second;
						m_agent_threads.erase( it );
					}
				}

				return result;
			}